

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

bool __thiscall
QWidgetLineControl::finishChange
          (QWidgetLineControl *this,int validateFromState,bool update,bool edited)

{
  int pos;
  bool bVar1;
  int iVar2;
  ushort uVar3;
  long in_FS_OFFSET;
  int cursorCopy;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = *(ushort *)(this + 0x50);
  if ((uVar3 & 0x40) == 0) {
LAB_003f5a63:
    if ((char)uVar3 < '\0') {
      *(ushort *)(this + 0x50) = uVar3 & 0xff7f;
      selectionChanged(this);
    }
    if (*(int *)(this + 0x40) == *(int *)(this + 100)) {
      updateMicroFocus(this);
    }
    emitCursorPositionChanged(this);
  }
  else {
    *(ushort *)(this + 0x50) = uVar3 | 0x100;
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)(this + 0xa8));
    if (!bVar1) {
LAB_003f5972:
      if ((-1 < validateFromState && (uVar3 >> 8 & 1) != 0) && (((byte)this[0x51] & 1) == 0)) {
        if (*(long *)(this + 0x78) != 0) {
          bVar1 = false;
          goto LAB_003f5a96;
        }
        internalUndo(this,validateFromState);
        std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>::
        erase((vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_> *)
              (this + 0xf8),(Command *)((long)*(int *)(this + 0xf4) * 0x10 + *(long *)(this + 0xf8))
              ,*(Command **)(this + 0x100));
        if (*(int *)(this + 0xf4) < *(int *)(this + 0xf0)) {
          *(undefined4 *)(this + 0xf0) = 0xffffffff;
        }
        *(ushort *)(this + 0x50) = (ushort)*(undefined4 *)(this + 0x50) & 0xfebf | 0x100;
      }
      updateDisplayText(this,false);
      uVar3 = *(ushort *)(this + 0x50);
      if ((uVar3 & 0x40) != 0) {
        *(ushort *)(this + 0x50) = uVar3 & 0xffbf;
        local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        text((QString *)&local_48,this);
        if (edited) {
          textEdited(this,(QString *)&local_48);
        }
        textChanged(this,(QString *)&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        uVar3 = *(ushort *)(this + 0x50);
      }
      goto LAB_003f5a63;
    }
    local_48.d = *(Data **)(this + 0x18);
    local_48.ptr = *(char16_t **)(this + 0x20);
    local_48.size = *(qsizetype *)(this + 0x28);
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pos = *(int *)(this + 0x40);
    iVar2 = (**(code **)(**(long **)(this + 0xb0) + 0x60))();
    *(ushort *)(this + 0x50) =
         (ushort)*(undefined4 *)(this + 0x50) & 0xfeff | (ushort)(iVar2 != 0) << 8;
    if (iVar2 == 0) {
      inputRejected(this);
LAB_003f5968:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      goto LAB_003f5972;
    }
    bVar1 = ::operator!=((QString *)(this + 0x18),(QString *)&local_48);
    if (!bVar1) {
      *(int *)(this + 0x40) = pos;
      goto LAB_003f5968;
    }
    internalSetText(this,(QString *)&local_48,pos,edited);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  bVar1 = true;
LAB_003f5a96:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetLineControl::finishChange(int validateFromState, bool update, bool edited)
{
    Q_UNUSED(update);

    if (m_textDirty) {
        // do validation
        bool wasValidInput = m_validInput;
        m_validInput = true;
#ifndef QT_NO_VALIDATOR
        if (m_validator) {
            QString textCopy = m_text;
            int cursorCopy = m_cursor;
            m_validInput = (m_validator->validate(textCopy, cursorCopy) != QValidator::Invalid);
            if (m_validInput) {
                if (m_text != textCopy) {
                    internalSetText(textCopy, cursorCopy, edited);
                    return true;
                }
                m_cursor = cursorCopy;
            } else {
                emit inputRejected();
            }
        }
#endif
        if (validateFromState >= 0 && wasValidInput && !m_validInput) {
            if (m_transactions.size())
                return false;
            internalUndo(validateFromState);
            m_history.erase(m_history.begin() + m_undoState, m_history.end());
            if (m_modifiedState > m_undoState)
                m_modifiedState = -1;
            m_validInput = true;
            m_textDirty = false;
        }
        updateDisplayText();

        if (m_textDirty) {
            m_textDirty = false;
            QString actualText = text();
            if (edited)
                emit textEdited(actualText);
            emit textChanged(actualText);
        }
    }
    if (m_selDirty) {
        m_selDirty = false;
        emit selectionChanged();
    }
    if (m_cursor == m_lastCursorPos)
        emit updateMicroFocus();
    emitCursorPositionChanged();
    return true;
}